

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O2

int head_size(int value)

{
  int iVar1;
  
  if (value < 0) {
    return 0;
  }
  if ((uint)value < 0x80) {
    iVar1 = 1;
  }
  else if ((uint)value < 0x800) {
    iVar1 = 2;
  }
  else if ((uint)value < 0x10000) {
    iVar1 = 3;
  }
  else {
    if (0x1fffff < (uint)value) {
      return 6 - (uint)((uint)value < 0x4000000);
    }
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

inline int head_size(int value)
{
    if (value < 0)
        return 0;
    else if (value <= 0x0000007F)
        return 1;
    else if (value <= 0x000007FF)
        return 2;
    else if (value <= 0x0000FFFF)
        return 3;
    else if (value <= 0x001FFFFF)
        return 4;
    else if (value <= 0x03FFFFFF)
        return 5;
    else if (value <= 0x7FFFFFFF)
        return 6;
    else
        return -1;
}